

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

lzma_match *
bt_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  ulong uVar1;
  uint uVar2;
  char *__assertion;
  uint32_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  uint uVar9;
  bool bVar10;
  uint32_t local_4c;
  uint32_t *local_48;
  
  local_4c = len_best;
  puVar8 = son + cyclic_pos * 2;
  local_48 = son + (ulong)(cyclic_pos * 2) + 1;
  uVar9 = 0;
  uVar6 = 0;
  do {
    bVar10 = depth == 0;
    depth = depth - 1;
    if ((bVar10) || (uVar2 = pos - cur_match, cyclic_size <= uVar2)) {
      *local_48 = 0;
      *puVar8 = 0;
      return matches;
    }
    uVar3 = 0;
    if (cyclic_pos < uVar2) {
      uVar3 = cyclic_size;
    }
    uVar5 = uVar6;
    if (uVar9 < uVar6) {
      uVar5 = uVar9;
    }
    uVar4 = (ulong)uVar5;
    puVar7 = son + (uVar3 + (cyclic_pos - uVar2)) * 2;
    if (cur[uVar4 - uVar2] == cur[uVar4]) {
      uVar5 = uVar5 + 1;
      if (len_limit < uVar5) {
        __assertion = "len <= limit";
        uVar9 = 0x2e;
LAB_003963c3:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,uVar9,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      if ((int)len_limit < 0) {
        __assertion = "limit <= UINT32_MAX / 2";
        uVar9 = 0x2f;
        goto LAB_003963c3;
      }
LAB_003962db:
      if (uVar5 < len_limit) {
        uVar4 = *(long *)(cur + ((ulong)uVar5 - (ulong)uVar2)) - *(long *)(cur + uVar5);
        if (uVar4 == 0) break;
        uVar1 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        uVar5 = ((uint)(uVar1 >> 3) & 0x1fffffff) + uVar5;
        if (len_limit <= uVar5) {
          uVar5 = len_limit;
        }
        uVar4 = (ulong)uVar5;
      }
      else {
        uVar4 = (ulong)len_limit;
      }
      uVar5 = (uint)uVar4;
      if (local_4c < uVar5) {
        matches->len = uVar5;
        matches->dist = uVar2 - 1;
        matches = matches + 1;
        local_4c = uVar5;
        if (uVar5 == len_limit) {
          *puVar8 = *puVar7;
          *local_48 = puVar7[1];
          return matches;
        }
      }
    }
    if (cur[uVar4 - uVar2] < cur[uVar4]) {
      *puVar8 = cur_match;
      puVar7 = puVar7 + 1;
      puVar8 = puVar7;
      uVar6 = (uint)uVar4;
    }
    else {
      *local_48 = cur_match;
      uVar9 = (uint)uVar4;
      local_48 = puVar7;
    }
    cur_match = *puVar7;
  } while( true );
  uVar5 = uVar5 + 8;
  goto LAB_003962db;
}

Assistant:

static lzma_match *
bt_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return matches;
		}

		uint32_t *const pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);

		const uint8_t *const pb = cur - delta;
		uint32_t len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			len = lzma_memcmplen(pb, cur, len + 1, len_limit);

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit) {
					*ptr1 = pair[0];
					*ptr0 = pair[1];
					return matches;
				}
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}